

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ConvertCameras(FBXConverter *this,Model *model,string *orig_name)

{
  pointer ppNVar1;
  Camera *cam;
  pointer ppNVar2;
  
  ppNVar1 = (model->attributes).
            super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar2 = (model->attributes).
                 super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1;
      ppNVar2 = ppNVar2 + 1) {
    if (*ppNVar2 != (NodeAttribute *)0x0) {
      cam = (Camera *)__dynamic_cast(*ppNVar2,&NodeAttribute::typeinfo,&Camera::typeinfo,0);
      if (cam != (Camera *)0x0) {
        ConvertCamera(this,cam,orig_name);
      }
    }
  }
  return;
}

Assistant:

void FBXConverter::ConvertCameras(const Model& model, const std::string &orig_name) {
            const std::vector<const NodeAttribute*>& node_attrs = model.GetAttributes();
            for (const NodeAttribute* attr : node_attrs) {
                const Camera* const cam = dynamic_cast<const Camera*>(attr);
                if (cam) {
                    ConvertCamera(*cam, orig_name);
                }
            }
        }